

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_padding.cpp
# Opt level: O2

void test_2d_dynamic<0ul,5ul,1ul,30ul>(void)

{
  reference pvVar1;
  int j;
  ulong uVar2;
  pointer t;
  pointer t_00;
  ulong local_58;
  value_type true_idx;
  vector<int,_std::allocator<int>_> data;
  
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x7a,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",(bool *)&data,
             (bool *)&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  true_idx = true_idx & 0xffffffffffffff00;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(0))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x7c,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",(bool *)&data,
             (bool *)&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(1))","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x7d,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",(bool *)&data,
             (bool *)&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x7f,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&data,(int *)&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  true_idx = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.stride(1))","N + X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x80,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&data,&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1e;
  true_idx = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x82,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&data,&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_00000023;
  true_idx = 0x23;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x83,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&data,&true_idx);
  true_idx = CONCAT44(true_idx._4_4_,0x2a);
  std::vector<int,_std::allocator<int>_>::vector
            (&data,0x23,(value_type_conflict1 *)&true_idx,(allocator_type *)&local_58);
  t_00 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  ;
  t = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  for (uVar2 = 0; uVar2 != 0x23; uVar2 = uVar2 + 1) {
    local_58 = uVar2;
    true_idx = uVar2;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
               ,0x91,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_58,&true_idx);
    if (0x1d < uVar2) {
      *t = 0x18;
      local_58._0_4_ = 0x18;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","24",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
                 ,0xa3,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",t,
                 (int *)&local_58);
      pvVar1 = std::vector<int,_std::allocator<int>_>::at(&data,uVar2);
      local_58 = CONCAT44(local_58._4_4_,0x18);
      boost::detail::test_eq_impl<int,int>
                ("(data.at(l.index(i, j)))","24",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
                 ,0xa6,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",pvVar1,
                 (int *)&local_58);
    }
    t = t + 1;
  }
  for (uVar2 = 0; uVar2 != 0x23; uVar2 = uVar2 + 1) {
    local_58 = uVar2;
    true_idx = uVar2;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
               ,0xb0,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_58,&true_idx);
    if (uVar2 < 0x1e) {
      local_58 = CONCAT44(local_58._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
                 ,199,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",t_00,
                 (int *)&local_58);
    }
    else {
      local_58._0_4_ = 0x18;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","24",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
                 ,0xbe,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",t_00,
                 (int *)&local_58);
      pvVar1 = std::vector<int,_std::allocator<int>_>::at(&data,uVar2);
      local_58 = CONCAT44(local_58._4_4_,0x18);
      boost::detail::test_eq_impl<int,int>
                ("(data.at(l.index(i, j)))","24",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
                 ,0xc1,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",pvVar1,
                 (int *)&local_58);
    }
    t_00 = t_00 + 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&data.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void test_2d_dynamic()
{ // {{{
    layout_mapping_left<
        dimensions<dyn, dyn>, dimensions<1, 1>, dimensions<dyn, dyn>
    > const l{{X, Y}, {}, {N, M}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.is_dynamic_stride(0)), false);
    BOOST_TEST_EQ((l.is_dynamic_stride(1)), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), N + X);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    // Initialize all elements to 42.
    vector<int> data(
        (l[0] + l.pads()[0]) * (l[1] + l.pads()[1]), 42
    );
    int* dptr = data.data();

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l.pads()[0] + l[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l.pads()[0] + l[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}